

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

void doDecodeTile(exr_context_t f,pixels *p,int xs,int ys)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  undefined4 in_register_0000000c;
  int *func;
  char **ptr_00;
  int iVar10;
  long lVar11;
  long lVar12;
  int32_t tileh;
  int32_t tilew;
  int32_t linestride;
  int32_t pixelstride;
  int32_t tlevy;
  int32_t tlevx;
  void *ptr;
  exr_chunk_info_t cinfo;
  exr_decode_pipeline_t decoder;
  int local_2a4;
  int local_2a0;
  int local_29c;
  char *local_298;
  int local_290;
  int local_28c;
  int32_t local_288;
  int local_284;
  int local_280;
  int local_27c;
  exr_context_t local_278;
  char *local_270;
  undefined1 local_268 [64];
  char local_228 [8];
  long local_220;
  short local_218;
  
  if ((xs != 1) || (ys != 1)) {
    core_test_fail("xs == 1 && ys == 1",(char *)0x3de,0x18272a,
                   (char *)CONCAT44(in_register_0000000c,ys));
  }
  func = &local_280;
  iVar3 = exr_get_tile_levels(f,0,&local_27c);
  if (iVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(iVar3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    core_test_fail("exr_get_tile_levels (f, 0, &tlevx, &tlevy)",(char *)0x3df,0x18272a,(char *)func)
    ;
  }
  if ((local_27c == 1) && (local_280 == 1)) {
    pcVar7 = (char *)0x0;
    iVar3 = exr_get_tile_sizes(f,0,0,0,&local_2a0,&local_2a4);
    if (iVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
      pcVar9 = (char *)exr_get_default_error_message(iVar3);
      if (pcVar9 == (char *)0x0) {
        std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
      }
      else {
        sVar8 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,sVar8);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      core_test_fail("exr_get_tile_sizes (f, 0, 0, 0, &tilew, &tileh)",(char *)0x3e2,0x18272a,pcVar7
                    );
    }
    if ((local_2a0 != 0x20) || (local_2a4 != 0x20)) {
      core_test_fail("tilew == 32 && tileh == 32",(char *)0x3e3,0x18272a,pcVar7);
    }
    bVar1 = true;
    iVar3 = 0x1d;
    local_298 = (char *)0x0;
    local_278 = f;
    do {
      iVar4 = 0x11;
      local_290 = iVar3;
      iVar3 = 0;
      do {
        local_29c = iVar3;
        pcVar9 = local_228;
        pcVar7 = local_298;
        local_28c = iVar4;
        iVar3 = exr_read_tile_chunk_info(f,0,local_29c,local_298,0,0,local_268);
        if (iVar3 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
          pcVar9 = (char *)exr_get_default_error_message(iVar3);
          if (pcVar9 == (char *)0x0) {
            std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
          }
          else {
            sVar8 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,sVar8);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          core_test_fail("exr_read_tile_chunk_info (f, 0, tilex, tiley, 0, 0, &cinfo)",(char *)0x3f1
                         ,0x18272a,pcVar7);
        }
        if (bVar1) {
          iVar3 = exr_decoding_initialize(f,0,local_268);
          if (iVar3 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
            pcVar7 = (char *)exr_get_default_error_message(iVar3);
            if (pcVar7 == (char *)0x0) {
              std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
            }
            else {
              sVar8 = strlen(pcVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
            core_test_fail("exr_decoding_initialize (f, 0, &cinfo, &decoder)",(char *)0x3f5,0x18272a
                           ,pcVar9);
          }
        }
        else {
          iVar3 = exr_decoding_update(f,0,local_268);
          if (iVar3 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
            pcVar7 = (char *)exr_get_default_error_message(iVar3);
            if (pcVar7 == (char *)0x0) {
              std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
            }
            else {
              sVar8 = strlen(pcVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
            core_test_fail("exr_decoding_update (f, 0, &cinfo, &decoder)",(char *)0x3fa,0x18272a,
                           pcVar9);
          }
        }
        if (0 < local_218) {
          iVar4 = local_2a4 * (int)local_298;
          iVar3 = p->_stride_x;
          iVar10 = local_2a0 * local_29c;
          lVar12 = 0;
          lVar11 = 0;
          do {
            lVar2 = local_220;
            ptr_00 = &local_270;
            fill_pointers(p,(exr_coding_channel_info_t *)(local_220 + lVar12),iVar10 + iVar4 * iVar3
                          ,ptr_00,&local_284,&local_288);
            iVar5 = (int)*(short *)(lVar2 + 0x1c + lVar12);
            if (local_284 != iVar5) {
              core_test_fail("curchan.user_bytes_per_element == pixelstride",(char *)0x40a,0x18272a,
                             (char *)ptr_00);
            }
            *(char **)(local_220 + 0x28 + lVar12) = local_270;
            *(int *)(local_220 + 0x20 + lVar12) = iVar5;
            *(int32_t *)(local_220 + 0x24 + lVar12) = local_288;
            lVar11 = lVar11 + 1;
            lVar12 = lVar12 + 0x30;
            pcVar9 = local_270;
          } while (lVar11 < local_218);
        }
        f = local_278;
        if (bVar1) {
          iVar3 = exr_decoding_choose_default_routines(local_278,0,local_228);
          if (iVar3 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
            pcVar7 = (char *)exr_get_default_error_message(iVar3);
            if (pcVar7 == (char *)0x0) {
              std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
            }
            else {
              sVar8 = strlen(pcVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
            core_test_fail("exr_decoding_choose_default_routines (f, 0, &decoder)",(char *)0x414,
                           0x18272a,pcVar9);
          }
        }
        iVar3 = exr_decoding_run(f,0,local_228);
        if (iVar3 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
          pcVar7 = (char *)exr_get_default_error_message(iVar3);
          if (pcVar7 == (char *)0x0) {
            std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
          }
          else {
            sVar8 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          core_test_fail("exr_decoding_run (f, 0, &decoder)",(char *)0x416,0x18272a,pcVar9);
        }
        iVar4 = local_28c + local_2a0;
        bVar1 = false;
        iVar3 = local_29c + 1;
      } while (iVar4 < 0x56c);
      iVar3 = local_290 + local_2a4;
      pcVar7 = (char *)(ulong)((int)local_298 + 1);
      bVar1 = false;
      local_298 = pcVar7;
      if (0xbb < iVar3) {
        iVar3 = exr_decoding_destroy(f,local_228);
        if (iVar3 == 0) {
          return;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
        pcVar9 = (char *)exr_get_default_error_message(iVar3);
        if (pcVar9 == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,sVar8);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        core_test_fail("exr_decoding_destroy (f, &decoder)",(char *)0x41a,0x18272a,pcVar7);
      }
    } while( true );
  }
  core_test_fail("tlevx == 1 && tlevy == 1",(char *)0x3e0,0x18272a,(char *)func);
}

Assistant:

static void
doDecodeTile (exr_context_t f, pixels& p, int xs, int ys)
{
    int32_t               tlevx, tlevy;
    int32_t               tilew, tileh;
    int32_t               tilex, tiley;
    int                   y, endy;
    int                   x, endx;
    exr_chunk_info_t      cinfo;
    exr_decode_pipeline_t decoder;
    bool                  first = true;

    EXRCORE_TEST (xs == 1 && ys == 1);
    EXRCORE_TEST_RVAL (exr_get_tile_levels (f, 0, &tlevx, &tlevy));
    EXRCORE_TEST (tlevx == 1 && tlevy == 1);

    EXRCORE_TEST_RVAL (exr_get_tile_sizes (f, 0, 0, 0, &tilew, &tileh));
    EXRCORE_TEST (tilew == 32 && tileh == 32);

    y     = IMG_DATA_Y * ys;
    endy  = y + IMG_HEIGHT * ys;
    tiley = 0;
    for (; y < endy; y += tileh, ++tiley)
    {
        tilex = 0;

        x    = IMG_DATA_X * xs;
        endx = x + IMG_WIDTH * xs;
        for (; x < endx; x += tilew, ++tilex)
        {
            EXRCORE_TEST_RVAL (
                exr_read_tile_chunk_info (f, 0, tilex, tiley, 0, 0, &cinfo));
            if (first)
            {
                EXRCORE_TEST_RVAL (
                    exr_decoding_initialize (f, 0, &cinfo, &decoder));
            }
            else
            {
                EXRCORE_TEST_RVAL (
                    exr_decoding_update (f, 0, &cinfo, &decoder));
            }

            int32_t idxoffset = tiley * tileh * p._stride_x + tilex * tilew;

            for (int c = 0; c < decoder.channel_count; ++c)
            {
                const exr_coding_channel_info_t& curchan = decoder.channels[c];
                void*                            ptr;
                int32_t                          pixelstride;
                int32_t                          linestride;

                fill_pointers (
                    p, curchan, idxoffset, &ptr, &pixelstride, &linestride);

                // make sure the setup has initialized our bytes for us
                EXRCORE_TEST (curchan.user_bytes_per_element == pixelstride);

                decoder.channels[c].decode_to_ptr     = (uint8_t*) ptr;
                decoder.channels[c].user_pixel_stride = pixelstride;
                decoder.channels[c].user_line_stride  = linestride;
            }

            if (first)
            {
                EXRCORE_TEST_RVAL (
                    exr_decoding_choose_default_routines (f, 0, &decoder));
            }
            EXRCORE_TEST_RVAL (exr_decoding_run (f, 0, &decoder));
            first = false;
        }
    }
    EXRCORE_TEST_RVAL (exr_decoding_destroy (f, &decoder));
}